

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O3

void __thiscall NaVector::import_from_file(NaVector *this,char *szFilePath)

{
  int iVar1;
  uint uVar2;
  FILE *__stream;
  undefined4 extraout_var;
  undefined4 *puVar3;
  uint uVar4;
  uint n;
  NaReal fVal;
  uint local_3c;
  undefined8 local_38;
  undefined8 local_30;
  
  if (szFilePath == (char *)0x0) {
    puVar3 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar3 = 0;
  }
  else {
    __stream = fopen(szFilePath,"rt");
    if (__stream == (FILE *)0x0) {
      puVar3 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar3 = 5;
    }
    else {
      iVar1 = __isoc99_fscanf(__stream,"%u\n",&local_3c);
      if (iVar1 == 1) {
        (*this->_vptr_NaVector[4])(this,(ulong)local_3c);
        iVar1 = (*this->_vptr_NaVector[6])(this);
        if (iVar1 != 0) {
          uVar4 = 0;
          do {
            iVar1 = __isoc99_fscanf(__stream,"%lg",&local_30);
            if (iVar1 != 1) goto LAB_00154fd9;
            local_38 = local_30;
            iVar1 = (*this->_vptr_NaVector[7])(this,(ulong)uVar4);
            *(undefined8 *)CONCAT44(extraout_var,iVar1) = local_38;
            uVar4 = uVar4 + 1;
            uVar2 = (*this->_vptr_NaVector[6])(this);
          } while (uVar4 < uVar2);
        }
        fclose(__stream);
        return;
      }
LAB_00154fd9:
      puVar3 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar3 = 7;
    }
  }
  __cxa_throw(puVar3,&NaException::typeinfo,0);
}

Assistant:

void
NaVector::import_from_file (const char* szFilePath)
{
    if(NULL == szFilePath)
        throw(na_null_pointer);

    FILE    *fp = fopen(szFilePath, "rt"); // rt
    if(NULL == fp)
        throw(na_cant_open_file);

    unsigned    n;
    if(1 != fscanf(fp, "%u\n", &n))
        throw(na_read_error);

    new_dim(n);

    unsigned    i;
    for(i = 0; i < dim(); ++i){
        NaReal  fVal;
        if(1 != fscanf(fp, "%lg", &fVal))
            throw(na_read_error);
        fetch(i) = fVal;
    }

    fclose(fp);
}